

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

void upb::generator::WriteMiniTableMultipleSources
               (DefPoolPair *pools,FileDefPtr file,MiniTableOptions *options,
               GeneratorContext *context)

{
  MessageDefPtr message;
  EnumDefPtr e;
  FieldDefPtr ext;
  MiniTableOptions *pMVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Output *pOVar5;
  FileDefPtr file_00;
  FileDefPtr file_01;
  FileDefPtr file_02;
  int *in_R9;
  pointer pMVar6;
  string_view src;
  string_view src_00;
  string_view src_01;
  string_view full_name;
  string_view full_name_00;
  string_view full_name_01;
  Output output;
  int i;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> enums;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> extensions;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> messages;
  Output local_f0;
  char local_cc [4];
  pointer local_c8;
  string local_c0;
  GeneratorContext *local_a0;
  MiniTableOptions *local_98;
  DefPoolPair *local_90;
  LogMessageFatal local_88;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> local_78;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> local_60;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> local_48;
  long *plVar4;
  
  local_a0 = context;
  local_90 = pools;
  SortedMessages(&local_48,file);
  SortedExtensions(&local_60,file);
  local_98 = options;
  SortedEnums(&local_78,file,kClosedEnums);
  pMVar1 = local_98;
  local_cc[0] = '\0';
  local_cc[1] = '\0';
  local_cc[2] = '\0';
  local_cc[3] = '\0';
  local_c8 = local_48.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (local_48.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pMVar6 = local_48.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      message.ptr_ = pMVar6->ptr_;
      local_f0.output_._M_dataplus._M_p = (pointer)&local_f0.output_.field_2;
      local_f0.output_._M_string_length = 0;
      local_f0.output_.field_2._M_local_buf[0] = '\0';
      WriteMiniTableSourceIncludes(file,pMVar1,&local_f0);
      pOVar5 = &local_f0;
      anon_unknown_7::WriteMessage(message,local_90,pMVar1,&local_f0);
      upb_MessageDef_FullName(message.ptr_);
      full_name._M_str = local_cc;
      full_name._M_len = (size_t)pOVar5;
      MultipleSourceFilename_abi_cxx11_(&local_c0,(generator *)file.ptr_,file_00,full_name,in_R9);
      iVar3 = (*local_a0->_vptr_GeneratorContext[2])(local_a0,&local_c0);
      plVar4 = (long *)CONCAT44(extraout_var,iVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      context = (GeneratorContext *)0x9;
      src._M_str = local_f0.output_._M_dataplus._M_p;
      src._M_len = local_f0.output_._M_string_length;
      absl::lts_20250127::Cord::Cord((Cord *)&local_c0,src,kConstructorString);
      cVar2 = (**(code **)(*plVar4 + 0x38))(plVar4,&local_c0);
      if (cVar2 == '\0') {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/minitable/generator.cc"
                   ,0x1c6,"stream->WriteCord(absl::Cord(output.output()))");
        goto LAB_0021ff67;
      }
      absl::lts_20250127::Cord::~Cord((Cord *)&local_c0);
      (**(code **)(*plVar4 + 8))(plVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0.output_._M_dataplus._M_p != &local_f0.output_.field_2) {
        operator_delete(local_f0.output_._M_dataplus._M_p,
                        CONCAT71(local_f0.output_.field_2._M_allocated_capacity._1_7_,
                                 local_f0.output_.field_2._M_local_buf[0]) + 1);
      }
      pMVar6 = pMVar6 + 1;
    } while (pMVar6 != local_c8);
  }
  pMVar1 = local_98;
  local_c8 = (pointer)local_78.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  if (local_78.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pMVar6 = (pointer)local_78.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    do {
      e.ptr_ = (upb_EnumDef *)pMVar6->ptr_;
      local_f0.output_._M_dataplus._M_p = (pointer)&local_f0.output_.field_2;
      local_f0.output_._M_string_length = 0;
      local_f0.output_.field_2._M_local_buf[0] = '\0';
      WriteMiniTableSourceIncludes(file,pMVar1,&local_f0);
      anon_unknown_7::WriteEnum(e,&local_f0);
      upb_EnumDef_FullName(e.ptr_);
      full_name_00._M_str = local_cc;
      full_name_00._M_len = (size_t)context;
      MultipleSourceFilename_abi_cxx11_(&local_c0,(generator *)file.ptr_,file_01,full_name_00,in_R9)
      ;
      iVar3 = (*local_a0->_vptr_GeneratorContext[2])(local_a0,&local_c0);
      plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      context = (GeneratorContext *)0x9;
      src_00._M_str = local_f0.output_._M_dataplus._M_p;
      src_00._M_len = local_f0.output_._M_string_length;
      absl::lts_20250127::Cord::Cord((Cord *)&local_c0,src_00,kConstructorString);
      cVar2 = (**(code **)(*plVar4 + 0x38))(plVar4,&local_c0);
      if (cVar2 == '\0') {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/minitable/generator.cc"
                   ,0x1ce,"stream->WriteCord(absl::Cord(output.output()))");
        goto LAB_0021ff67;
      }
      absl::lts_20250127::Cord::~Cord((Cord *)&local_c0);
      (**(code **)(*plVar4 + 8))(plVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0.output_._M_dataplus._M_p != &local_f0.output_.field_2) {
        operator_delete(local_f0.output_._M_dataplus._M_p,
                        CONCAT71(local_f0.output_.field_2._M_allocated_capacity._1_7_,
                                 local_f0.output_.field_2._M_local_buf[0]) + 1);
      }
      pMVar6 = pMVar6 + 1;
    } while (pMVar6 != local_c8);
  }
  local_c8 = (pointer)local_60.
                      super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
  if (local_60.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pMVar6 = (pointer)local_60.
                      super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    do {
      ext.ptr_ = (upb_FieldDef *)pMVar6->ptr_;
      local_f0.output_._M_dataplus._M_p = (pointer)&local_f0.output_.field_2;
      local_f0.output_._M_string_length = 0;
      local_f0.output_.field_2._M_local_buf[0] = '\0';
      WriteMiniTableSourceIncludes(file,pMVar1,&local_f0);
      anon_unknown_7::WriteExtension(local_90,ext,&local_f0);
      upb_FieldDef_FullName(ext.ptr_);
      full_name_01._M_str = local_cc;
      full_name_01._M_len = (size_t)context;
      MultipleSourceFilename_abi_cxx11_(&local_c0,(generator *)file.ptr_,file_02,full_name_01,in_R9)
      ;
      iVar3 = (*local_a0->_vptr_GeneratorContext[2])(local_a0,&local_c0);
      plVar4 = (long *)CONCAT44(extraout_var_01,iVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      context = (GeneratorContext *)0x9;
      src_01._M_str = local_f0.output_._M_dataplus._M_p;
      src_01._M_len = local_f0.output_._M_string_length;
      absl::lts_20250127::Cord::Cord((Cord *)&local_c0,src_01,kConstructorString);
      cVar2 = (**(code **)(*plVar4 + 0x38))(plVar4,&local_c0);
      if (cVar2 == '\0') {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/minitable/generator.cc"
                   ,0x1d6,"stream->WriteCord(absl::Cord(output.output()))");
LAB_0021ff67:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_88);
      }
      absl::lts_20250127::Cord::~Cord((Cord *)&local_c0);
      (**(code **)(*plVar4 + 8))(plVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0.output_._M_dataplus._M_p != &local_f0.output_.field_2) {
        operator_delete(local_f0.output_._M_dataplus._M_p,
                        CONCAT71(local_f0.output_.field_2._M_allocated_capacity._1_7_,
                                 local_f0.output_.field_2._M_local_buf[0]) + 1);
      }
      pMVar6 = pMVar6 + 1;
    } while (pMVar6 != local_c8);
  }
  if ((pointer)local_78.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_60.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WriteMiniTableMultipleSources(
    const DefPoolPair& pools, upb::FileDefPtr file,
    const MiniTableOptions& options,
    google::protobuf::compiler::GeneratorContext* context) {
  std::vector<upb::MessageDefPtr> messages = SortedMessages(file);
  std::vector<upb::FieldDefPtr> extensions = SortedExtensions(file);
  std::vector<upb::EnumDefPtr> enums = SortedEnums(file, kClosedEnums);
  int i = 0;

  for (auto message : messages) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteMessage(message, pools, options, output);
    auto stream = absl::WrapUnique(
        context->Open(MultipleSourceFilename(file, message.full_name(), &i)));
    ABSL_CHECK(stream->WriteCord(absl::Cord(output.output())));
  }
  for (const auto e : enums) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteEnum(e, output);
    auto stream = absl::WrapUnique(
        context->Open(MultipleSourceFilename(file, e.full_name(), &i)));
    ABSL_CHECK(stream->WriteCord(absl::Cord(output.output())));
  }
  for (const auto ext : extensions) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteExtension(pools, ext, output);
    auto stream = absl::WrapUnique(
        context->Open(MultipleSourceFilename(file, ext.full_name(), &i)));
    ABSL_CHECK(stream->WriteCord(absl::Cord(output.output())));
  }
}